

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O2

void __thiscall CLayerTiles::PrepareForSave(CLayerTiles *this)

{
  uchar *puVar1;
  byte bVar2;
  CEditor *pCVar3;
  uint uVar4;
  CTile *pCVar5;
  uchar uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong unaff_R12;
  int iVar16;
  ulong unaff_R14;
  byte unaff_R15B;
  
  uVar9 = this->m_Height;
  uVar4 = this->m_Width;
  uVar8 = 0;
  uVar13 = 0;
  if (0 < (int)uVar4) {
    uVar13 = (ulong)uVar4;
  }
  uVar7 = 0;
  if (0 < (int)uVar9) {
    uVar7 = (ulong)uVar9;
  }
  lVar14 = 1;
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    pCVar5 = this->m_pTiles;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      (&pCVar5[uVar15].m_Index)[lVar14] = (&pCVar5[uVar15].m_Index)[lVar14] & 0xb;
      if (*(char *)((long)pCVar5 + uVar15 * 4 + lVar14 + -1) == '\0') {
        (&pCVar5[uVar15].m_Index)[lVar14] = '\0';
      }
    }
    lVar14 = lVar14 + (long)(int)uVar4 * 4;
  }
  iVar16 = this->m_Image;
  if (((long)iVar16 != -1) && ((this->m_Color).a == 0xff)) {
    uVar4 = this->m_Width;
    uVar8 = 0;
    uVar13 = 0;
    if (0 < (int)uVar4) {
      uVar13 = (ulong)uVar4;
    }
    lVar14 = 1;
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pCVar3 = (this->super_CLayer).m_pEditor;
      pCVar5 = this->m_pTiles;
      for (unaff_R14 = 0; uVar13 != unaff_R14; unaff_R14 = unaff_R14 + 1) {
        unaff_R12 = (ulong)*(byte *)((long)pCVar5 + unaff_R14 * 4 + lVar14 + -1);
        unaff_R15B = (pCVar3->m_Map).m_lImages.list[iVar16]->m_aTileFlags[unaff_R12];
        puVar1 = &pCVar5[unaff_R14].m_Index + lVar14;
        *puVar1 = *puVar1 | unaff_R15B;
      }
      lVar14 = lVar14 + (long)(int)uVar4 * 4;
    }
  }
  pCVar5 = this->m_pTiles;
  uVar13 = 0;
  uVar8 = (ulong)(uVar4 * uVar9);
  if ((int)(uVar4 * uVar9) < 1) {
    uVar8 = uVar13;
  }
  cVar10 = -1;
  iVar16 = 0;
  do {
    if (uVar8 == uVar13) {
      if (this->m_pSaveTiles != (CTile *)0x0) {
        operator_delete__(this->m_pSaveTiles);
        uVar9 = this->m_Height;
      }
      uVar8 = 0xffffffffffffffff;
      if (-1 < iVar16) {
        uVar8 = (long)iVar16 << 2;
      }
      pCVar5 = (CTile *)operator_new__(uVar8);
      this->m_pSaveTiles = pCVar5;
      this->m_SaveTilesSize = iVar16 << 2;
      iVar16 = this->m_Width;
      uVar6 = 0xff;
      iVar11 = 0;
      for (uVar8 = 0; (long)uVar8 <= (long)(int)(uVar9 * iVar16); uVar8 = uVar8 + 1) {
        if (((uVar6 == 0xff || uVar8 == uVar9 * iVar16) ||
            (this->m_pTiles[uVar8].m_Index != (uchar)unaff_R12)) ||
           (this->m_pTiles[uVar8].m_Flags != unaff_R15B)) {
          iVar12 = iVar11;
          if (uVar8 != 0) {
            pCVar5 = this->m_pSaveTiles;
            iVar12 = iVar11 + 1;
            pCVar5[iVar11].m_Index = (uchar)unaff_R12;
            pCVar5[iVar11].m_Flags = unaff_R15B;
            pCVar5[iVar11].m_Skip = uVar6;
            pCVar5[iVar11].m_Reserved = (uchar)unaff_R14;
            iVar16 = this->m_Width;
            uVar9 = this->m_Height;
          }
          iVar11 = iVar12;
          if (uVar8 != uVar9 * iVar16) {
            pCVar5 = this->m_pTiles;
            unaff_R12 = (ulong)pCVar5[uVar8].m_Index;
            unaff_R15B = pCVar5[uVar8].m_Flags;
            unaff_R14 = (ulong)pCVar5[uVar8].m_Reserved;
            uVar6 = '\0';
          }
        }
        else {
          uVar6 = uVar6 + '\x01';
        }
      }
      return;
    }
    uVar4 = (uint)pCVar5[uVar13].m_Index;
    if (cVar10 == -1) {
      bVar2 = pCVar5[uVar13].m_Flags;
LAB_001970d3:
      unaff_R15B = bVar2;
      unaff_R14 = (ulong)pCVar5[uVar13].m_Reserved;
      iVar16 = iVar16 + 1;
      cVar10 = '\0';
    }
    else {
      bVar2 = pCVar5[uVar13].m_Flags;
      if ((pCVar5[uVar13].m_Index != (byte)unaff_R12) || (bVar2 != unaff_R15B)) goto LAB_001970d3;
      cVar10 = cVar10 + '\x01';
      uVar4 = (uint)unaff_R12;
    }
    uVar13 = uVar13 + 1;
    unaff_R12 = (ulong)uVar4;
  } while( true );
}

Assistant:

void CLayerTiles::PrepareForSave()
{
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			m_pTiles[y*m_Width+x].m_Flags &= TILEFLAG_VFLIP|TILEFLAG_HFLIP|TILEFLAG_ROTATE;
			if(m_pTiles[y*m_Width+x].m_Index == 0)
				m_pTiles[y*m_Width+x].m_Flags = 0;
		}

	if(m_Image != -1 && m_Color.a == 255)
	{
		for(int y = 0; y < m_Height; y++)
			for(int x = 0; x < m_Width; x++)
				m_pTiles[y*m_Width+x].m_Flags |= m_pEditor->m_Map.m_lImages[m_Image]->m_aTileFlags[m_pTiles[y*m_Width+x].m_Index];
	}

	int NumSaveTiles = 0; // number of unique tiles that we have to save
	CTile Tile; // current tile to be duplicated
	Tile.m_Skip = MAX_SKIP; // tell the code that we can't skip the first tile

	int NumHitMaxSkip = -1;

	for(int i = 0; i < m_Width * m_Height; i++)
	{
		// we can only store MAX_SKIP empty tiles in one tile
		if(Tile.m_Skip == MAX_SKIP)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
			NumHitMaxSkip++;
		}
		// tile is different from last one? - can't skip it
		else if(m_pTiles[i].m_Index != Tile.m_Index || m_pTiles[i].m_Flags != Tile.m_Flags)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
		}
		// if the tile is the same as the previous one - no need to
		// save it separately
		else
			Tile.m_Skip++;
	}

	if(m_pSaveTiles)
		delete [] m_pSaveTiles;

	m_pSaveTiles = new CTile[NumSaveTiles];
	m_SaveTilesSize = sizeof(CTile) * NumSaveTiles;

	int NumWrittenSaveTiles = 0;
	Tile.m_Skip = MAX_SKIP;
	for(int i = 0; i < m_Width * m_Height + 1; i++)
	{
		// again, if an tile is the same as the previous one
		// and we have place to store it, skip it!
		// if we are at the end of the layer, write one more tile
		if(i != m_Width * m_Height && Tile.m_Skip != MAX_SKIP && m_pTiles[i].m_Index == Tile.m_Index && m_pTiles[i].m_Flags == Tile.m_Flags)
		{
			Tile.m_Skip++;
		}
		// tile is not skippable
		else
		{
			// if this is not the first tile, we have to save the previous
			// tile beforehand
			if(i != 0)
				m_pSaveTiles[NumWrittenSaveTiles++] = Tile;

			// if this isn't the last tile, store it so we can check how
			// many tiles to skip
			if(i != m_Width * m_Height)
			{
				Tile = m_pTiles[i];
				Tile.m_Skip = 0;
			}
		}
	}
}